

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsViewPrivate::findItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsViewPrivate *this,
          QRegion *exposedRegion,bool *allItems,QTransform *viewTransform)

{
  QGraphicsView *this_00;
  char cVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  QRect *r;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QPainterPath exposedScenePath;
  QRegion adjustedRegion;
  QPainterPath local_90 [8];
  QRectF local_88;
  QRect local_68;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  auVar6 = QRegion::boundingRect();
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_4_ = (undefined4)(auVar6._0_8_ + 0xffffffff);
  auVar5._8_4_ = (undefined4)(auVar6._8_8_ + 1);
  auVar5._4_4_ = auVar5._8_4_;
  local_68._0_8_ = CONCAT44(auVar6._4_4_,auVar5._0_4_) + -0x100000000;
  local_68._8_8_ = auVar5._8_8_ + 0x100000000;
  QGraphicsView::mapToScene((QPolygonF *)&local_88,this_00,&local_68);
  QPolygonF::boundingRect();
  if ((QArrayData *)local_88.xp != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88.xp)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88.xp)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88.xp,0x10,0x10);
    }
  }
  QGraphicsScene::sceneRect(&local_88,(QGraphicsScene *)(this->scene).wp.value);
  cVar1 = QRectF::contains(&local_58);
  if (cVar1 == '\0') {
    iVar2 = QRegion::rectCount();
    if (iVar2 == 1) {
      iVar2 = QTransform::type();
      if (iVar2 < 3) {
        QGraphicsScene::items
                  (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,&local_58,
                   IntersectsItemBoundingRect,AscendingOrder,viewTransform);
        goto LAB_0063ed9c;
      }
    }
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)&local_68);
    piVar3 = (int *)QRegion::begin();
    piVar4 = (int *)QRegion::end();
    if (piVar3 != piVar4) {
      do {
        local_88.xp = (qreal)CONCAT44(piVar3[1] + -1,*piVar3 + -1);
        local_88.yp = (qreal)CONCAT44(piVar3[3] + 1,piVar3[2] + 1);
        QRegion::operator+=((QRegion *)&local_68,(QRect *)&local_88);
        piVar3 = piVar3 + 4;
      } while (piVar3 != piVar4);
    }
    local_88.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    qt_regionToPath((QRegion *)local_90);
    QGraphicsView::mapToScene((QGraphicsView *)&local_88,(QPainterPath *)this_00);
    QPainterPath::~QPainterPath(local_90);
    QGraphicsScene::items
              (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,
               (QPainterPath *)&local_88,IntersectsItemBoundingRect,AscendingOrder,viewTransform);
    QPainterPath::~QPainterPath((QPainterPath *)&local_88);
    QRegion::~QRegion((QRegion *)&local_68);
  }
  else {
    *allItems = true;
    QGraphicsScene::items
              (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,AscendingOrder);
  }
LAB_0063ed9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsViewPrivate::findItems(const QRegion &exposedRegion, bool *allItems,
                                                       const QTransform &viewTransform) const
{
    Q_Q(const QGraphicsView);

    // Step 1) If all items are contained within the expose region, then
    // return a list of all visible items. ### the scene's growing bounding
    // rect does not take into account untransformable items.
    const QRectF exposedRegionSceneBounds = q->mapToScene(exposedRegion.boundingRect().adjusted(-1, -1, 1, 1))
                                            .boundingRect();
    if (exposedRegionSceneBounds.contains(scene->sceneRect())) {
        Q_ASSERT(allItems);
        *allItems = true;

        // All items are guaranteed within the exposed region.
        return scene->items(Qt::AscendingOrder);
    }

    // Step 2) If the expose region is a simple rect and the view is only
    // translated or scaled, search for items using
    // QGraphicsScene::items(QRectF).
    bool simpleRectLookup =  exposedRegion.rectCount() == 1 && matrix.type() <= QTransform::TxScale;
    if (simpleRectLookup) {
        return scene->items(exposedRegionSceneBounds,
                            Qt::IntersectsItemBoundingRect,
                            Qt::AscendingOrder, viewTransform);
    }

    // If the region is complex or the view has a complex transform, adjust
    // the expose region, convert it to a path, and then search for items
    // using QGraphicsScene::items(QPainterPath);
    QRegion adjustedRegion;
    for (const QRect &r : exposedRegion)
        adjustedRegion += r.adjusted(-1, -1, 1, 1);

    const QPainterPath exposedScenePath(q->mapToScene(qt_regionToPath(adjustedRegion)));
    return scene->items(exposedScenePath, Qt::IntersectsItemBoundingRect,
                        Qt::AscendingOrder, viewTransform);
}